

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall defyx::JitCompilerX86::h_FSUB_M(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  
  instr->dst = instr->dst & 3;
  genAddressReg(this,instr,true);
  puVar2 = this->code;
  iVar3 = this->codePos;
  puVar1 = puVar2 + (long)iVar3 + 4;
  puVar1[0] = '$';
  puVar1[1] = '\x06';
  puVar2 = puVar2 + iVar3;
  puVar2[0] = 0xf3;
  puVar2[1] = 'D';
  puVar2[2] = '\x0f';
  puVar2[3] = 0xe6;
  iVar3 = this->codePos + 6;
  this->codePos = iVar3;
  builtin_memcpy(this->code + iVar3,"fA\x0f\\",4);
  iVar3 = this->codePos + 4;
  this->codePos = iVar3;
  this->code[iVar3] = instr->dst * '\b' + 0xc4;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::h_FSUB_M(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		genAddressReg(instr);
		emit(REX_CVTDQ2PD_XMM12);
		emit(REX_SUBPD);
		emitByte(0xc4 + 8 * instr.dst);
	}